

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
* __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::objectFields
          (set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
           *__return_storage_ptr__,Interpreter *this,HeapObject *obj_,bool manifesting)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
  local_50;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  objectFieldsAux((IdHideMap *)&local_50,this,obj_);
  for (p_Var2 = local_50._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &local_50._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    if (((char)obj_ == '\0') || (*(int *)&p_Var2[1]._M_parent != 0)) {
      std::
      _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
      ::_M_insert_unique<jsonnet::internal::Identifier_const*const&>
                ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                  *)__return_storage_ptr__,(Identifier **)(p_Var2 + 1));
    }
  }
  std::
  _Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
  ::~_Rb_tree(&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::set<const Identifier *> objectFields(const HeapObject *obj_, bool manifesting)
    {
        std::set<const Identifier *> r;
        for (const auto &pair : objectFieldsAux(obj_)) {
            if (!manifesting || pair.second != ObjectField::HIDDEN)
                r.insert(pair.first);
        }
        return r;
    }